

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

string * cmGeneratorExpression::Preprocess
                   (string *__return_storage_ptr__,string *input,PreprocessContext context,
                   bool resolveRelative)

{
  bool resolveRelative_local;
  PreprocessContext context_local;
  string *input_local;
  
  if (context == StripAllGeneratorExpressions) {
    stripAllGeneratorExpressions(__return_storage_ptr__,input);
  }
  else {
    if ((context != BuildInterface) && (context != InstallInterface)) {
      __assert_fail("0 && \"cmGeneratorExpression::Preprocess called with invalid args\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpression.cxx"
                    ,0x1b8,
                    "static std::string cmGeneratorExpression::Preprocess(const std::string &, PreprocessContext, bool)"
                   );
    }
    stripExportInterface(__return_storage_ptr__,input,context,resolveRelative);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpression::Preprocess(const std::string &input,
                                              PreprocessContext context,
                                              bool resolveRelative)
{
  if (context == StripAllGeneratorExpressions)
    {
    return stripAllGeneratorExpressions(input);
    }
  else if (context == BuildInterface || context == InstallInterface)
    {
    return stripExportInterface(input, context, resolveRelative);
    }

  assert(0 && "cmGeneratorExpression::Preprocess called with invalid args");
  return std::string();
}